

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O2

int __thiscall OpenMD::Polynomial<double>::degree(Polynomial<double> *this)

{
  _Rb_tree_node_base *p_Var1;
  _Rb_tree_color _Var2;
  
  _Var2 = _S_red;
  for (p_Var1 = (this->polyPairMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->polyPairMap_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    if ((int)_Var2 < (int)p_Var1[1]._M_color) {
      _Var2 = p_Var1[1]._M_color;
    }
  }
  return _Var2;
}

Assistant:

int degree() {
      int deg = 0;
      for (iterator i = polyPairMap_.begin(); i != polyPairMap_.end(); ++i) {
        if (i->first > deg) deg = i->first;
      }
      return deg;
    }